

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  
  pIVar1 = GImGui;
  if ((flags & 4U) != 0) {
    if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
      return false;
    }
    goto LAB_00126728;
  }
  switch(flags & 3) {
  case 0:
    if (GImGui->HoveredWindow != GImGui->CurrentWindow) {
      return false;
    }
    goto LAB_00126728;
  case 1:
    if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
      return false;
    }
    bVar2 = IsWindowChildOf(GImGui->HoveredWindow,GImGui->CurrentWindow);
    if (!bVar2) {
      return false;
    }
    goto LAB_00126728;
  case 2:
    pIVar3 = GImGui->CurrentWindow;
    pIVar4 = GImGui->HoveredWindow;
    break;
  case 3:
    pIVar3 = GImGui->CurrentWindow;
    pIVar4 = GImGui->HoveredRootWindow;
  }
  if (pIVar4 != pIVar3->RootWindow) {
    return false;
  }
LAB_00126728:
  bVar2 = IsWindowContentHoverable(pIVar1->HoveredRootWindow,flags);
  if ((bVar2) &&
     (((((flags & 0x20U) != 0 || (pIVar1->ActiveId == 0)) || (pIVar1->ActiveIdAllowOverlap != false)
       ) || (pIVar1->ActiveId == pIVar1->HoveredWindow->MoveId)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredRootWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredRootWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}